

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>::CompiledVm
          (CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false> *this)

{
  undefined8 *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  VmBase<randomx::AlignedAllocator<64UL>,_false> *in_stack_ffffffffffffffe0;
  
  VmBase<randomx::AlignedAllocator<64UL>,_false>::VmBase(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__CompiledVm_00191270;
  JitCompilerX86::JitCompilerX86(unaff_retaddr);
  JitCompilerX86::enableAll((JitCompilerX86 *)0x14d65c);
  return;
}

Assistant:

CompiledVm<Allocator, softAes, secureJit>::CompiledVm() {
		if (!secureJit) {
			compiler.enableAll(); //make JIT buffer both writable and executable
		}
	}